

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * print_object(cJSON *item,int depth,int fmt)

{
  bool bVar1;
  void *__s;
  void *__s_00;
  char *pcVar2;
  char *__s_01;
  size_t sVar3;
  size_t sVar4;
  int local_84;
  int local_6c;
  int fail;
  int numentries;
  cJSON *child;
  int local_58;
  int j;
  int i;
  int len;
  char *str;
  char *ret;
  char *ptr;
  char *out;
  char **names;
  char **entries;
  int fmt_local;
  int depth_local;
  cJSON *item_local;
  
  ptr = (char *)0x0;
  j = 7;
  local_58 = 0;
  _fail = item->child;
  local_6c = 0;
  bVar1 = false;
  for (; _fail != (cJSON *)0x0; _fail = _fail->next) {
    local_6c = local_6c + 1;
  }
  __s = (*cJSON_malloc)((long)local_6c << 3);
  if (__s == (void *)0x0) {
    item_local = (cJSON *)0x0;
  }
  else {
    __s_00 = (*cJSON_malloc)((long)local_6c << 3);
    if (__s_00 == (void *)0x0) {
      (*cJSON_free)(__s);
      item_local = (cJSON *)0x0;
    }
    else {
      memset(__s,0,(long)local_6c << 3);
      memset(__s_00,0,(long)local_6c << 3);
      _fail = item->child;
      if (fmt != 0) {
        j = depth + 8;
      }
      for (; _fail != (cJSON *)0x0; _fail = _fail->next) {
        pcVar2 = print_string_ptr(_fail->string);
        *(char **)((long)__s_00 + (long)local_58 * 8) = pcVar2;
        __s_01 = print_value(_fail,depth + 1,fmt);
        *(char **)((long)__s + (long)local_58 * 8) = __s_01;
        if ((pcVar2 == (char *)0x0) || (__s_01 == (char *)0x0)) {
          bVar1 = true;
        }
        else {
          sVar3 = strlen(__s_01);
          sVar4 = strlen(pcVar2);
          if (fmt == 0) {
            local_84 = 0;
          }
          else {
            local_84 = depth + 3;
          }
          j = j + (int)sVar3 + (int)sVar4 + 2 + local_84;
        }
        local_58 = local_58 + 1;
      }
      if (!bVar1) {
        ptr = (char *)(*cJSON_malloc)((long)j);
      }
      if (ptr == (char *)0x0) {
        bVar1 = true;
      }
      if (bVar1) {
        for (local_58 = 0; local_58 < local_6c; local_58 = local_58 + 1) {
          if (*(long *)((long)__s_00 + (long)local_58 * 8) != 0) {
            (*cJSON_free)(*(void **)((long)__s_00 + (long)local_58 * 8));
          }
          if (*(long *)((long)__s + (long)local_58 * 8) != 0) {
            (*cJSON_free)(*(void **)((long)__s + (long)local_58 * 8));
          }
        }
        (*cJSON_free)(__s_00);
        (*cJSON_free)(__s);
        item_local = (cJSON *)0x0;
      }
      else {
        *ptr = '{';
        ret = ptr + 1;
        if (fmt != 0) {
          ret = ptr + 2;
          ptr[1] = '\n';
        }
        *ret = '\0';
        for (local_58 = 0; local_58 < local_6c; local_58 = local_58 + 1) {
          if (fmt != 0) {
            for (child._4_4_ = 0; child._4_4_ < depth + 1; child._4_4_ = child._4_4_ + 1) {
              *ret = '\t';
              ret = ret + 1;
            }
          }
          strcpy(ret,*(char **)((long)__s_00 + (long)local_58 * 8));
          sVar3 = strlen(*(char **)((long)__s_00 + (long)local_58 * 8));
          pcVar2 = ret + sVar3;
          *pcVar2 = ':';
          ret = pcVar2 + 1;
          if (fmt != 0) {
            ret = pcVar2 + 2;
            pcVar2[1] = '\t';
          }
          strcpy(ret,*(char **)((long)__s + (long)local_58 * 8));
          sVar3 = strlen(*(char **)((long)__s + (long)local_58 * 8));
          pcVar2 = ret + sVar3;
          ret = pcVar2;
          if (local_58 != local_6c + -1) {
            ret = pcVar2 + 1;
            *pcVar2 = ',';
          }
          if (fmt != 0) {
            *ret = '\n';
            ret = ret + 1;
          }
          *ret = '\0';
          (*cJSON_free)(*(void **)((long)__s_00 + (long)local_58 * 8));
          (*cJSON_free)(*(void **)((long)__s + (long)local_58 * 8));
        }
        (*cJSON_free)(__s_00);
        (*cJSON_free)(__s);
        if (fmt != 0) {
          for (local_58 = 0; local_58 < depth; local_58 = local_58 + 1) {
            *ret = '\t';
            ret = ret + 1;
          }
        }
        *ret = '}';
        ret[1] = '\0';
        item_local = (cJSON *)ptr;
      }
    }
  }
  return (char *)item_local;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Allocate space for the names and the objects */
	entries=(char**)cJSON_malloc(numentries*sizeof(char*));
	if (!entries) return 0;
	names=(char**)cJSON_malloc(numentries*sizeof(char*));
	if (!names) {cJSON_free(entries);return 0;}
	memset(entries,0,sizeof(char*)*numentries);
	memset(names,0,sizeof(char*)*numentries);

	/* Collect all the results into our arrays: */
	child=item->child;depth++;if (fmt) len+=depth;
	while (child)
	{
		names[i]=str=print_string_ptr(child->string);
		entries[i++]=ret=print_value(child,depth,fmt);
		if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
		child=child->next;
	}
	
	/* Try to allocate the output string */
	if (!fail) out=(char*)cJSON_malloc(len);
	if (!out) fail=1;

	/* Handle failure */
	if (fail)
	{
		for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
		cJSON_free(names);cJSON_free(entries);
		return 0;
	}
	
	/* Compose the output: */
	*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
	for (i=0;i<numentries;i++)
	{
		if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
		strcpy(ptr,names[i]);ptr+=strlen(names[i]);
		*ptr++=':';if (fmt) *ptr++='\t';
		strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
		if (i!=numentries-1) *ptr++=',';
		if (fmt) *ptr++='\n';*ptr=0;
		cJSON_free(names[i]);cJSON_free(entries[i]);
	}
	
	cJSON_free(names);cJSON_free(entries);
	if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
	*ptr++='}';*ptr++=0;
	return out;	
}